

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_stream_test.c
# Opt level: O0

void test_tcp_listen_activation(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_stream *s;
  nng_stream *s_00;
  bool bVar4;
  nng_err result__12;
  nng_err result__11;
  nng_iov iov2;
  nng_iov iov1;
  char local_a8 [4];
  char buf2 [4];
  char buf1 [4];
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  char url [32];
  nng_stream *c2;
  nng_stream *c1;
  nng_stream_dialer *d;
  nng_aio *aio2;
  nng_aio *aio1;
  int port;
  int fd;
  char *addr;
  nng_stream_listener *l2;
  nng_stream_listener *l1;
  
  nuts_scratch_addr_zero("tcp4",0x40,test_tcp_listen_activation::nuts_addr_);
  _port = test_tcp_listen_activation::nuts_addr_;
  nVar1 = nng_aio_alloc(&aio2,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,199,"%s: expected success, got %s (%d)","nng_aio_alloc(&aio1, NULL, NULL)"
                         ,pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_aio_alloc((nng_aio **)&d,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,200,"%s: expected success, got %s (%d)","nng_aio_alloc(&aio2, NULL, NULL)"
                         ,pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_aio_set_timeout(aio2,2000);
  nng_aio_set_timeout((nng_aio *)d,2000);
  nVar1 = nng_stream_listener_alloc(&l2,_port);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0xcd,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_alloc(&l1, addr)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_listener_listen(l2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0xce,"%s: expected success, got %s (%d)","nng_stream_listener_listen(l1)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_listener_get_int(l2,"tcp-bound-port",(int *)&aio1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0xd0,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_get_int(l1, NNG_OPT_TCP_BOUND_PORT, &port)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  snprintf((char *)&result__1,0x20,"tcp4://127.0.0.1:%u",(ulong)(uint)aio1);
  nVar1 = nng_stream_dialer_alloc((nng_stream_dialer **)&c1,(char *)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0xd3,"%s: expected success, got %s (%d)",
                         "nng_stream_dialer_alloc(&d, url)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_listener_get_int(l2,"listen-fd",(int *)((long)&aio1 + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0xd5,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_get_int(l1, NNG_OPT_LISTEN_FD, &fd)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  aio1._4_4_ = dup(aio1._4_4_);
  iVar2 = acutest_check_((uint)(-2 < aio1._4_4_),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0xda,"%s","fd >= -1");
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_listener_alloc((nng_stream_listener **)&addr,"tcp4://");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0xdc,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_alloc(&l2, \"tcp4://\")",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_listener_set_int((nng_stream_listener *)addr,"listen-fd",aio1._4_4_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0xdd,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_set_int(l2, NNG_OPT_LISTEN_FD, fd)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_stream_dialer_dial((nng_stream_dialer *)c1,(nng_aio *)d);
  nng_stream_listener_accept((nng_stream_listener *)addr,aio2);
  nng_aio_wait(aio2);
  nng_aio_wait((nng_aio *)d);
  nVar1 = nng_aio_result(aio2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0xe4,"%s: expected success, got %s (%d)","nng_aio_result(aio1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  buf2 = (char  [4])nng_aio_result((nng_aio *)d);
  bVar4 = buf2 == (char  [4])0x0;
  pcVar3 = nng_strerror((nng_err)buf2);
  iVar2 = acutest_check_((uint)bVar4,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0xe5,"%s: expected success, got %s (%d)","nng_aio_result(aio2)",pcVar3,
                         buf2);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  s = (nng_stream *)nng_aio_get_output(aio2,0);
  s_00 = (nng_stream *)nng_aio_get_output((nng_aio *)d,0);
  iov2.iov_len = (size_t)local_a8;
  iov1.iov_buf = (void *)0x4;
  _result__12 = (void *)((long)&iov1.iov_len + 4);
  iov2.iov_buf = (void *)0x4;
  nng_aio_set_iov(aio2,1,(nng_iov *)&iov2.iov_len);
  nng_aio_set_iov((nng_aio *)d,1,(nng_iov *)&result__12);
  snprintf(local_a8,4,"abc");
  nng_stream_send(s,aio2);
  nng_stream_recv(s_00,(nng_aio *)d);
  nng_aio_wait(aio2);
  nng_aio_wait((nng_aio *)d);
  nVar1 = nng_aio_result(aio2);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x100,"%s: expected success, got %s (%d)","nng_aio_result(aio1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_aio_result((nng_aio *)d);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x101,"%s: expected success, got %s (%d)","nng_aio_result(aio2)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  iVar2 = strcmp(local_a8,(char *)((long)&iov1.iov_len + 4));
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x103,"%s == %s",local_a8,(undefined1 *)((long)&iov1.iov_len + 4),nVar1);
  nng_stream_listener_free(l2);
  nng_stream_listener_free((nng_stream_listener *)addr);
  nng_stream_dialer_free((nng_stream_dialer *)c1);
  nng_stream_free(s);
  nng_stream_free(s_00);
  nng_aio_free(aio2);
  nng_aio_free((nng_aio *)d);
  return;
}

Assistant:

void
test_tcp_listen_activation(void)
{
#if defined(NNG_PLATFORM_POSIX)
	nng_stream_listener *l1;
	nng_stream_listener *l2;
	char                *addr;
	int                  fd;
	int                  port;
	nng_aio             *aio1;
	nng_aio             *aio2;
	nng_stream_dialer   *d;
	nng_stream          *c1, *c2;
	char                 url[32];

	NUTS_ADDR_ZERO(addr, "tcp4");
	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio2, NULL, NULL));

	nng_aio_set_timeout(aio1, 2000);
	nng_aio_set_timeout(aio2, 2000);

	NUTS_PASS(nng_stream_listener_alloc(&l1, addr));
	NUTS_PASS(nng_stream_listener_listen(l1));
	NUTS_PASS(
	    nng_stream_listener_get_int(l1, NNG_OPT_TCP_BOUND_PORT, &port));

	snprintf(url, sizeof(url), "tcp4://127.0.0.1:%u", port);
	NUTS_PASS(nng_stream_dialer_alloc(&d, url));

	NUTS_PASS(nng_stream_listener_get_int(l1, NNG_OPT_LISTEN_FD, &fd));
	fd = dup(fd);
	// dupe this because we need to separate the file descriptors to
	// prevent confusion when we clean up (only one FD can be registered at
	// a time!)
	NUTS_ASSERT(fd >= -1);

	NUTS_PASS(nng_stream_listener_alloc(&l2, "tcp4://"));
	NUTS_PASS(nng_stream_listener_set_int(l2, NNG_OPT_LISTEN_FD, fd));
	nng_stream_dialer_dial(d, aio2);
	nng_stream_listener_accept(l2, aio1);

	nng_aio_wait(aio1);
	nng_aio_wait(aio2);

	NUTS_PASS(nng_aio_result(aio1));
	NUTS_PASS(nng_aio_result(aio2));

	c1 = nng_aio_get_output(aio1, 0);
	c2 = nng_aio_get_output(aio2, 0);

	char    buf1[4];
	char    buf2[4];
	nng_iov iov1;
	nng_iov iov2;

	iov1.iov_buf = buf1;
	iov1.iov_len = sizeof(buf1);

	iov2.iov_buf = buf2;
	iov2.iov_len = sizeof(buf2);

	nng_aio_set_iov(aio1, 1, &iov1);
	nng_aio_set_iov(aio2, 1, &iov2);

	snprintf(buf1, sizeof(buf1), "abc");

	nng_stream_send(c1, aio1);
	nng_stream_recv(c2, aio2);

	nng_aio_wait(aio1);
	nng_aio_wait(aio2);

	NUTS_PASS(nng_aio_result(aio1));
	NUTS_PASS(nng_aio_result(aio2));

	NUTS_MATCH(buf1, buf2);

	nng_stream_listener_free(l1);
	nng_stream_listener_free(l2);
	nng_stream_dialer_free(d);
	nng_stream_free(c1);
	nng_stream_free(c2);
	nng_aio_free(aio1);
	nng_aio_free(aio2);
#elif defined(NNG_PLATFORM_WINDOWS)
	// Windows requires that we not have created an I/O completion port yet
	// on the incoming FD.
	nng_stream_listener *l2;
	SOCKET               s;
	char                *addr;
	int                  port;
	nng_aio             *aio1;
	nng_aio             *aio2;
	nng_stream_dialer   *d;
	nng_stream          *c1, *c2;
	char                 url[32];
	SOCKADDR_IN          sin;

	NUTS_ADDR_ZERO(addr, "tcp4");
	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio2, NULL, NULL));

	nng_aio_set_timeout(aio1, 20000);
	nng_aio_set_timeout(aio2, 20000);

	s                   = socket(AF_INET, SOCK_STREAM, 0);
	sin.sin_family      = AF_INET;
	sin.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
	sin.sin_port        = 0;
	int len             = sizeof(sin);
	NUTS_ASSERT(bind(s, (SOCKADDR *) &sin, sizeof(sin)) == 0);
	NUTS_ASSERT(getsockname(s, (SOCKADDR *) &sin, &len) == 0);
	port = ntohs(sin.sin_port);
	NUTS_ASSERT(listen(s, SOMAXCONN) == 0);

	NUTS_PASS(nng_stream_listener_alloc(&l2, "tcp4://"));
	NUTS_PASS(nng_stream_listener_set_int(l2, NNG_OPT_LISTEN_FD, (int) s));
	snprintf(url, sizeof(url), "tcp://127.0.0.1:%u", port);
	NUTS_PASS(nng_stream_dialer_alloc(&d, url));
	nng_stream_listener_accept(l2, aio1);

	nng_stream_dialer_dial(d, aio2);

	nng_aio_wait(aio1);
	NUTS_PASS(nng_aio_result(aio1));

	nng_aio_wait(aio2);
	NUTS_PASS(nng_aio_result(aio2));

	c1 = nng_aio_get_output(aio1, 0);
	c2 = nng_aio_get_output(aio2, 0);

	char    buf1[4];
	char    buf2[4];
	nng_iov iov1;
	nng_iov iov2;

	iov1.iov_buf = buf1;
	iov1.iov_len = sizeof(buf1);

	iov2.iov_buf = buf2;
	iov2.iov_len = sizeof(buf2);

	nng_aio_set_iov(aio1, 1, &iov1);
	nng_aio_set_iov(aio2, 1, &iov2);

	snprintf(buf1, sizeof(buf1), "abc");

	nng_stream_send(c1, aio1);
	nng_stream_recv(c2, aio2);

	nng_aio_wait(aio1);
	nng_aio_wait(aio2);

	NUTS_PASS(nng_aio_result(aio1));
	NUTS_PASS(nng_aio_result(aio2));

	NUTS_MATCH(buf1, buf2);

	nng_stream_listener_free(l2);
	nng_stream_dialer_free(d);
	nng_stream_free(c1);
	nng_stream_free(c2);
	nng_aio_free(aio1);
	nng_aio_free(aio2);
#else
	NUTS_SKIP("Not Windows or POSIX");
#endif
}